

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeDrawList(ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  uint uVar1;
  ImDrawVert *pIVar2;
  ImGuiContext *pIVar3;
  unsigned_short *puVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  char *pcVar11;
  ImDrawCmd *pIVar12;
  ImGuiWindow *pIVar13;
  ImGuiContext *g;
  ImVec4 *buf_00;
  int iVar14;
  long lVar15;
  undefined4 uVar16;
  float fVar17;
  ImGuiListClipper clipper;
  ImVec2 triangle_1 [3];
  char buf [300];
  ImGuiListClipper local_1e8;
  ImGuiContext *local_1d0;
  ImDrawCmd *local_1c8;
  ImDrawList *local_1c0;
  unsigned_short *local_1b8;
  ImDrawList *local_1b0;
  long local_1a8;
  ImGuiContext *local_1a0;
  ulong local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  ImVec4 local_168 [18];
  undefined1 local_3c [12];
  
  iVar14 = (draw_list->CmdBuffer).Size;
  lVar15 = (long)iVar14;
  if ((0 < lVar15) && (pIVar12 = (draw_list->CmdBuffer).Data, pIVar12[lVar15 + -1].ElemCount == 0))
  {
    iVar14 = iVar14 - (uint)(pIVar12[lVar15 + -1].UserCallback == (ImDrawCallback)0x0);
  }
  local_1d0 = GImGui;
  pcVar11 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar11 = draw_list->_OwnerName;
  }
  bVar5 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds",label,pcVar11,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar14);
  pIVar3 = GImGui;
  pIVar13 = GImGui->CurrentWindow;
  pIVar13->WriteAccessed = true;
  if (pIVar13->DrawList == draw_list) {
    pIVar13->WriteAccessed = true;
    if (pIVar13->SkipItems == false) {
      (pIVar13->DC).CursorPos.x = (pIVar3->Style).ItemSpacing.x + (pIVar13->DC).CursorPosPrevLine.x;
      (pIVar13->DC).CursorPos.y = (pIVar13->DC).CursorPosPrevLine.y;
      (pIVar13->DC).CurrLineSize = (pIVar13->DC).PrevLineSize;
      (pIVar13->DC).CurrLineTextBaseOffset = (pIVar13->DC).PrevLineTextBaseOffset;
    }
    local_168[0].x = 1.0;
    local_168[0].y = 0.4;
    local_168[0].z = 0.4;
    local_168[0].w = 1.0;
    TextColored(local_168,"CURRENTLY APPENDING");
    if (!bVar5) {
      return;
    }
  }
  else {
    local_1c0 = &pIVar3->ForegroundDrawList;
    if ((window != (ImGuiWindow *)0x0) && (bVar6 = IsItemHovered(0), bVar6)) {
      local_168[0].y = (window->Size).y + (window->Pos).y;
      local_168[0].x = (window->Size).x + (window->Pos).x;
      ImDrawList::AddRect(local_1c0,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
    }
    if (!bVar5) {
      return;
    }
    if ((window != (ImGuiWindow *)0x0) && (window->WasActive == false)) {
      TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");
    }
    if (0 < iVar14) {
      pIVar12 = (draw_list->CmdBuffer).Data;
      local_1a8 = (long)iVar14 * 0x38;
      local_1a0 = pIVar3;
      local_1b0 = draw_list;
      do {
        if (pIVar12->UserCallback == (ImDrawCallback)0x0) {
          ImFormatString((char *)local_168,300,
                         "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                         SUB84((double)(pIVar12->ClipRect).x,0),
                         SUB84((double)(pIVar12->ClipRect).y,0),(double)(pIVar12->ClipRect).z,
                         (double)(pIVar12->ClipRect).w,(ulong)pIVar12->ElemCount / 3,
                         pIVar12->TextureId);
          bVar5 = TreeNode((void *)(((long)pIVar12 - (long)(draw_list->CmdBuffer).Data >> 3) *
                                   0x6db6db6db6db6db7),"%s",local_168);
          pIVar13 = (ImGuiWindow *)0x0;
          bVar6 = IsItemHovered(0);
          if ((bVar6) &&
             ((bVar6 = (local_1d0->DebugMetricsConfig).ShowDrawCmdMesh, bVar6 != false ||
              ((local_1d0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes == true)))) {
            DebugNodeDrawCmdShowMeshAndBoundingBox
                      (pIVar13,draw_list,pIVar12,bVar6,
                       (local_1d0->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
          }
          if (bVar5) {
            if ((draw_list->IdxBuffer).Size < 1) {
              local_1b8 = (unsigned_short *)0x0;
            }
            else {
              local_1b8 = (draw_list->IdxBuffer).Data;
            }
            uVar1 = pIVar12->VtxOffset;
            uVar7 = pIVar12->IdxOffset;
            pIVar2 = (draw_list->VtxBuffer).Data;
            uVar10 = pIVar12->ElemCount;
            uVar16 = 0;
            if (uVar7 < uVar10 + uVar7) {
              fVar17 = 0.0;
              do {
                local_1e8.DisplayStart = 0;
                local_1e8.DisplayEnd = 0;
                local_1e8.ItemsCount = 0;
                local_1e8.StepNo = 0;
                local_1e8.ItemsHeight = 0.0;
                local_1e8.StartPosY = 0.0;
                lVar15 = 0;
                do {
                  uVar10 = (uint)((ulong)uVar7 + lVar15);
                  if (local_1b8 != (unsigned_short *)0x0) {
                    uVar10 = (uint)local_1b8[(ulong)uVar7 + lVar15 & 0xffffffff];
                  }
                  *(ImVec2 *)(&local_1e8.DisplayStart + lVar15 * 2) =
                       pIVar2[(ulong)uVar1 + (ulong)uVar10].pos;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 3);
                fVar17 = fVar17 + ABS(((float)local_1e8.DisplayEnd - (float)local_1e8.StepNo) *
                                      local_1e8.ItemsHeight +
                                      ((float)local_1e8.StepNo - local_1e8.StartPosY) *
                                      (float)local_1e8.DisplayStart +
                                      (local_1e8.StartPosY - (float)local_1e8.DisplayEnd) *
                                      (float)local_1e8.ItemsCount) * 0.5;
                uVar10 = pIVar12->ElemCount;
                uVar7 = uVar7 + 3;
              } while (uVar7 < uVar10 + pIVar12->IdxOffset);
              uVar16 = SUB84((double)fVar17,0);
              uVar7 = pIVar12->IdxOffset;
            }
            ImFormatString((char *)local_168,300,
                           "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px",
                           uVar16,(ulong)uVar10,(ulong)pIVar12->VtxOffset,(ulong)uVar7);
            local_1e8.DisplayStart = 0;
            local_1e8.DisplayEnd = 0;
            Selectable((char *)local_168,false,0,(ImVec2 *)&local_1e8);
            pIVar13 = (ImGuiWindow *)0x0;
            bVar5 = IsItemHovered(0);
            if (bVar5) {
              DebugNodeDrawCmdShowMeshAndBoundingBox(pIVar13,draw_list,pIVar12,true,false);
            }
            ImGuiListClipper::ImGuiListClipper(&local_1e8);
            local_1e8.StartPosY = (GImGui->CurrentWindow->DC).CursorPos.y;
            local_1e8.ItemsCount = pIVar12->ElemCount / 3;
            local_1e8.StepNo = 0;
            local_1e8.ItemsHeight = -1.0;
            local_1e8.DisplayStart = -1;
            local_1e8.DisplayEnd = 0;
            local_1c8 = pIVar12;
            while (bVar5 = ImGuiListClipper::Step(&local_1e8), bVar5) {
              if (local_1e8.DisplayStart < local_1e8.DisplayEnd) {
                iVar14 = local_1e8.DisplayStart * 3 + local_1c8->IdxOffset;
                uVar7 = local_1e8.DisplayStart;
                do {
                  puVar4 = local_1b8;
                  local_198 = (ulong)uVar7;
                  local_188[0].x = 0.0;
                  local_188[0].y = 0.0;
                  local_188[1].x = 0.0;
                  local_188[1].y = 0.0;
                  local_188[2].x = 0.0;
                  local_188[2].y = 0.0;
                  lVar15 = 0;
                  buf_00 = local_168;
                  do {
                    if (local_1b8 == (unsigned_short *)0x0) {
                      uVar7 = iVar14 + (int)lVar15;
                    }
                    else {
                      uVar7 = (uint)puVar4[iVar14 + lVar15];
                    }
                    lVar9 = (long)(int)uVar7;
                    local_188[lVar15] = pIVar2[(ulong)uVar1 + lVar9].pos;
                    pcVar11 = "     ";
                    if (lVar15 == 0) {
                      pcVar11 = "Vert:";
                    }
                    iVar8 = ImFormatString((char *)buf_00,(size_t)(local_3c + -(long)buf_00),
                                           "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                                           SUB84((double)pIVar2[(ulong)uVar1 + lVar9].pos.x,0),
                                           SUB84((double)pIVar2[(ulong)uVar1 + lVar9].pos.y,0),
                                           (double)pIVar2[(ulong)uVar1 + lVar9].uv.x,
                                           (double)pIVar2[(ulong)uVar1 + lVar9].uv.y,pcVar11,
                                           (ulong)(uint)(iVar14 + (int)lVar15),
                                           (ulong)pIVar2[(ulong)uVar1 + lVar9].col);
                    buf_00 = (ImVec4 *)((long)&buf_00->x + (long)iVar8);
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  local_190.x = 0.0;
                  local_190.y = 0.0;
                  Selectable((char *)local_168,false,0,&local_190);
                  pIVar3 = local_1a0;
                  bVar5 = IsItemHovered(0);
                  if (bVar5) {
                    uVar7 = (pIVar3->ForegroundDrawList).Flags;
                    (pIVar3->ForegroundDrawList).Flags = uVar7 & 0xfffffffe;
                    ImDrawList::AddPolyline(local_1c0,local_188,3,0xff00ffff,true,1.0);
                    (pIVar3->ForegroundDrawList).Flags = uVar7;
                  }
                  iVar14 = iVar14 + 3;
                  uVar7 = (int)local_198 + 1;
                } while ((int)uVar7 < local_1e8.DisplayEnd);
              }
            }
            TreePop();
            ImGuiListClipper::~ImGuiListClipper(&local_1e8);
            pIVar12 = local_1c8;
            draw_list = local_1b0;
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar12->UserCallback,pIVar12->UserCallbackData);
        }
        pIVar12 = pIVar12 + 1;
      } while (pIVar12 < (ImDrawCmd *)
                         ((long)&(((draw_list->CmdBuffer).Data)->ClipRect).x + local_1a8));
    }
  }
  TreePop();
  return;
}

Assistant:

void ImGui::DebugNodeDrawList(ImGuiWindow* window, const ImDrawList* draw_list, const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;
    int cmd_count = draw_list->CmdBuffer.Size;
    if (cmd_count > 0 && draw_list->CmdBuffer.back().ElemCount == 0 && draw_list->CmdBuffer.back().UserCallback == NULL)
        cmd_count--;
    bool node_open = TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, cmd_count);
    if (draw_list == GetWindowDrawList())
    {
        SameLine();
        TextColored(ImVec4(1.0f, 0.4f, 0.4f, 1.0f), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
        if (node_open)
            TreePop();
        return;
    }

    ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
    if (window && IsItemHovered())
        fg_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!node_open)
        return;

    if (window && !window->WasActive)
        TextDisabled("Warning: owning Window is inactive. This DrawList is not being rendered!");

    for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.Data; pcmd < draw_list->CmdBuffer.Data + cmd_count; pcmd++)
    {
        if (pcmd->UserCallback)
        {
            BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
            continue;
        }

        char buf[300];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "DrawCmd:%5d tris, Tex 0x%p, ClipRect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
            pcmd->ElemCount / 3, (void*)(intptr_t)pcmd->TextureId,
            pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
        bool pcmd_node_open = TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "%s", buf);
        if (IsItemHovered() && (cfg->ShowDrawCmdMesh || cfg->ShowDrawCmdBoundingBoxes) && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, cfg->ShowDrawCmdMesh, cfg->ShowDrawCmdBoundingBoxes);
        if (!pcmd_node_open)
            continue;

        // Calculate approximate coverage area (touched pixel count)
        // This will be in pixels squared as long there's no post-scaling happening to the renderer output.
        const ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
        const ImDrawVert* vtx_buffer = draw_list->VtxBuffer.Data + pcmd->VtxOffset;
        float total_area = 0.0f;
        for (unsigned int idx_n = pcmd->IdxOffset; idx_n < pcmd->IdxOffset + pcmd->ElemCount; )
        {
            ImVec2 triangle[3];
            for (int n = 0; n < 3; n++, idx_n++)
                triangle[n] = vtx_buffer[idx_buffer ? idx_buffer[idx_n] : idx_n].pos;
            total_area += ImTriangleArea(triangle[0], triangle[1], triangle[2]);
        }

        // Display vertex information summary. Hover to get all triangles drawn in wire-frame
        ImFormatString(buf, IM_ARRAYSIZE(buf), "Mesh: ElemCount: %d, VtxOffset: +%d, IdxOffset: +%d, Area: ~%0.f px", pcmd->ElemCount, pcmd->VtxOffset, pcmd->IdxOffset, total_area);
        Selectable(buf);
        if (IsItemHovered() && fg_draw_list)
            DebugNodeDrawCmdShowMeshAndBoundingBox(window, draw_list, pcmd, true, false);

        // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
        ImGuiListClipper clipper;
        clipper.Begin(pcmd->ElemCount / 3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
        while (clipper.Step())
            for (int prim = clipper.DisplayStart, idx_i = pcmd->IdxOffset + clipper.DisplayStart * 3; prim < clipper.DisplayEnd; prim++)
            {
                char* buf_p = buf, * buf_end = buf + IM_ARRAYSIZE(buf);
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++, idx_i++)
                {
                    const ImDrawVert& v = vtx_buffer[idx_buffer ? idx_buffer[idx_i] : idx_i];
                    triangle[n] = v.pos;
                    buf_p += ImFormatString(buf_p, buf_end - buf_p, "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n",
                        (n == 0) ? "Vert:" : "     ", idx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                }

                Selectable(buf, false);
                if (fg_draw_list && IsItemHovered())
                {
                    ImDrawListFlags backup_flags = fg_draw_list->Flags;
                    fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f);
                    fg_draw_list->Flags = backup_flags;
                }
            }
        TreePop();
    }
    TreePop();
}